

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# thread.c
# Opt level: O2

void uv_sem_post(uv_sem_t *sem)

{
  uv_mutex_t *mutex;
  int iVar1;
  
  if (platform_needs_custom_semaphore != 0) {
    mutex = (uv_mutex_t *)sem->__align;
    uv_mutex_lock(mutex);
    iVar1 = *(int *)((long)mutex + 0x58);
    *(int *)((long)mutex + 0x58) = iVar1 + 1;
    if (iVar1 == 0) {
      uv_cond_signal((uv_cond_t *)(mutex + 1));
    }
    uv_mutex_unlock(mutex);
    return;
  }
  iVar1 = sem_post((sem_t *)sem);
  if (iVar1 == 0) {
    return;
  }
  abort();
}

Assistant:

void uv_sem_post(uv_sem_t* sem) {
  if (platform_needs_custom_semaphore)
    uv__custom_sem_post(sem);
  else
    uv__sem_post(sem);
}